

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

void decode_nvrm_ioctl_create_dma56(nvrm_ioctl_create_dma56 *s)

{
  FILE *__stream;
  char *pcVar1;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad1,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_sep,(ulong)s->cls);
  pcVar1 = nvrm_get_class_name(s->cls);
  if (pcVar1 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar1);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sflags: 0x%08x",nvrm_sep,(ulong)s->flags);
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sparent: 0x%08x",nvrm_sep,(ulong)s->parent);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->parent,"parent");
  if (s->_pad3 != 0) {
    fprintf(_stdout,"%s%s_pad3: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad3,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sbase: 0x%016lx",nvrm_sep,s->base);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%slimit: 0x%016lx",nvrm_sep,s->limit);
  __stream = _stdout;
  pcVar1 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  if (nvrm_show_unk_zero_fields != 0 || s->unk34 != 0) {
    fprintf(_stdout,"%sunk34: 0x%08x");
  }
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_dma56(struct nvrm_ioctl_create_dma56 *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_class(s, cls);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_pad_x32(s, _pad3);
	nvrm_print_x64(s, base);
	nvrm_print_x64(s, limit);
	nvrm_print_status(s, status);
	nvrm_print_x32(s, unk34);
	nvrm_print_ln();
}